

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decoder_suite.cpp
# Opt level: O2

void compact_int64_suite::test_array16_int64_empty(void)

{
  value_type input [3];
  decoder decoder;
  value local_64;
  uchar local_60 [4];
  undefined4 local_5c;
  decoder local_58;
  
  local_60[2] = '\0';
  local_60[0] = 0xbe;
  local_60[1] = '\0';
  trial::protocol::bintoken::detail::decoder::decoder<unsigned_char[3]>
            (&local_58,(uchar (*) [3])local_60);
  local_64 = local_58.current.code;
  local_5c = 0xbe;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::bintoken::token::code::value,trial::protocol::bintoken::token::code::value>
            ("decoder.code()","token::code::array16_int64",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/decoder_suite.cpp"
             ,0xae9,"void compact_int64_suite::test_array16_int64_empty()",&local_64,&local_5c);
  local_64 = trial::protocol::bintoken::token::symbol::convert(local_58.current.code);
  local_5c = 7;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::bintoken::token::symbol::value,trial::protocol::bintoken::token::symbol::value>
            ("decoder.symbol()","token::symbol::array",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/decoder_suite.cpp"
             ,0xaea,"void compact_int64_suite::test_array16_int64_empty()",&local_64,&local_5c);
  local_64 = trial::protocol::bintoken::detail::decoder::category(&local_58);
  local_5c = 2;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::bintoken::token::category::value,trial::protocol::bintoken::token::category::value>
            ("decoder.category()","token::category::data",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/decoder_suite.cpp"
             ,0xaeb,"void compact_int64_suite::test_array16_int64_empty()",&local_64,&local_5c);
  boost::detail::test_impl
            ("decoder.literal().empty()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/decoder_suite.cpp"
             ,0xaec,"void compact_int64_suite::test_array16_int64_empty()",
             local_58.current.view._M_len == 0);
  trial::protocol::bintoken::detail::decoder::next(&local_58);
  local_64 = local_58.current.code;
  local_5c = 0;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::bintoken::token::code::value,trial::protocol::bintoken::token::code::value>
            ("decoder.code()","token::code::end",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/decoder_suite.cpp"
             ,0xaee,"void compact_int64_suite::test_array16_int64_empty()",&local_64,&local_5c);
  return;
}

Assistant:

void test_array16_int64_empty()
{
    const value_type input[] = { token::code::array16_int64, 0x00, 0x00 };
    format::detail::decoder decoder(input);
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.code(), token::code::array16_int64);
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.symbol(), token::symbol::array);
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.category(), token::category::data);
    TRIAL_PROTOCOL_TEST(decoder.literal().empty());
    decoder.next();
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.code(), token::code::end);
}